

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple9.h
# Opt level: O1

void FastPForLib::Simple9<true,_false>::unpack2_14(uint32_t **out,uint32_t **in)

{
  uint *puVar1;
  uint *puVar2;
  
  puVar1 = *out;
  puVar2 = *in;
  *puVar1 = *puVar2 >> 0x1a & 3;
  puVar1[1] = *(byte *)((long)puVar2 + 3) & 3;
  puVar1[2] = *puVar2 >> 0x16 & 3;
  puVar1[3] = *puVar2 >> 0x14 & 3;
  puVar1[4] = *puVar2 >> 0x12 & 3;
  puVar1[5] = *(ushort *)((long)puVar2 + 2) & 3;
  puVar1[6] = *puVar2 >> 0xe & 3;
  puVar1[7] = *puVar2 >> 0xc & 3;
  puVar1[8] = *puVar2 >> 10 & 3;
  puVar1[9] = *puVar2 >> 8 & 3;
  puVar1[10] = *puVar2 >> 6 & 3;
  puVar1[0xb] = *puVar2 >> 4 & 3;
  puVar1[0xc] = *puVar2 >> 2 & 3;
  puVar1[0xd] = *puVar2 & 3;
  *in = puVar2 + 1;
  *out = puVar1 + 0xe;
  return;
}

Assistant:

void Simple9<MarkLength, hacked>::unpack2_14(uint32_t **out,
                                             const uint32_t **in) {
  uint32_t *pout;
  const uint32_t *pin;

  pout = *out;
  pin = *in;

  pout[0] = (pin[0] >> 26) & 0x03;
  pout[1] = (pin[0] >> 24) & 0x03;
  pout[2] = (pin[0] >> 22) & 0x03;
  pout[3] = (pin[0] >> 20) & 0x03;
  pout[4] = (pin[0] >> 18) & 0x03;
  pout[5] = (pin[0] >> 16) & 0x03;
  pout[6] = (pin[0] >> 14) & 0x03;
  pout[7] = (pin[0] >> 12) & 0x03;
  pout[8] = (pin[0] >> 10) & 0x03;
  pout[9] = (pin[0] >> 8) & 0x03;
  pout[10] = (pin[0] >> 6) & 0x03;
  pout[11] = (pin[0] >> 4) & 0x03;
  pout[12] = (pin[0] >> 2) & 0x03;
  pout[13] = pin[0] & 0x03;

  *in = pin + 1;
  *out = pout + 14;
}